

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O0

ExtractScriptData *
cfd::js::api::TransactionStructApiBase::ExtractLockingScript
          (ExtractScriptData *__return_storage_ptr__,Script *locking_script)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  ScriptOperator *pSVar4;
  int64_t iVar5;
  undefined1 local_100 [8];
  ByteData pubkey_byte;
  __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_e0;
  __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_d8;
  const_iterator itr;
  value_type local_b8;
  undefined1 local_a0 [8];
  ByteData program;
  undefined1 local_80 [7];
  uint8_t witness_version;
  undefined4 local_68;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_58 [8];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elems;
  string local_40 [8];
  string script_type;
  Script *locking_script_local;
  ExtractScriptData *extract_data;
  
  ExtractScriptData::ExtractScriptData(__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  cfd::core::Script::GetElementList();
  sVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    (local_58);
  if (sVar3 == 1) {
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
              (local_58,0);
    pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
    bVar1 = cfd::core::ScriptOperator::operator==
                      (pSVar4,(ScriptOperator *)&core::ScriptOperator::OP_TRUE);
    if ((bVar1 & 1) != 0) {
      __return_storage_ptr__->script_type = kTrue;
      local_68 = 1;
      goto LAB_0151e1a8;
    }
  }
  bVar1 = cfd::core::Script::IsEmpty();
  if ((bVar1 & 1) == 0) {
    bVar1 = cfd::core::Script::IsP2shScript();
    if ((bVar1 & 1) == 0) {
      bVar1 = cfd::core::Script::IsWitnessProgram();
      if ((bVar1 & 1) == 0) {
        sVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                size(local_58);
        if (sVar3 != 0) {
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          operator[](local_58,0);
          pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
          bVar1 = cfd::core::ScriptOperator::operator==
                            (pSVar4,(ScriptOperator *)&core::ScriptOperator::OP_RETURN);
          if ((bVar1 & 1) != 0) {
            __return_storage_ptr__->script_type = kNullData;
            local_68 = 1;
            goto LAB_0151e1a8;
          }
        }
        bVar1 = cfd::core::Script::IsP2pkScript();
        if ((bVar1 & 1) == 0) {
          bVar1 = cfd::core::Script::IsP2pkhScript();
          if ((bVar1 & 1) == 0) {
            bVar1 = cfd::core::Script::IsMultisigScript();
            if ((bVar1 & 1) == 0) {
              __return_storage_ptr__->script_type = kNonStandard;
              local_68 = 1;
            }
            else {
              __return_storage_ptr__->script_type = kMultisig;
              local_d8._M_current =
                   (ScriptElement *)
                   std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ::cbegin(local_58);
              __gnu_cxx::
              __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
              ::operator*(&local_d8);
              iVar5 = cfd::core::ScriptElement::GetNumber();
              __return_storage_ptr__->req_sigs = iVar5;
              __gnu_cxx::
              __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
              ::operator++(&local_d8);
              while( true ) {
                pubkey_byte.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::
                              vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ::cend(local_58);
                local_e0 = __gnu_cxx::
                           __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                           ::operator-((__normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                                        *)&pubkey_byte.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
                bVar2 = __gnu_cxx::operator!=(&local_d8,&local_e0);
                if (!bVar2) break;
                __gnu_cxx::
                __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                ::operator*(&local_d8);
                cfd::core::ScriptElement::GetBinaryData();
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                          (&__return_storage_ptr__->pushed_datas,(value_type *)local_100);
                core::ByteData::~ByteData((ByteData *)local_100);
                __gnu_cxx::
                __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                ::operator++(&local_d8);
              }
              local_68 = 1;
            }
          }
          else {
            __return_storage_ptr__->script_type = kPayToPubkeyHash;
            std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
            operator[](local_58,2);
            cfd::core::ScriptElement::GetBinaryData();
            std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                      (&__return_storage_ptr__->pushed_datas,(value_type *)&itr);
            core::ByteData::~ByteData((ByteData *)&itr);
            local_68 = 1;
          }
        }
        else {
          __return_storage_ptr__->script_type = kPayToPubkey;
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          operator[](local_58,0);
          cfd::core::ScriptElement::GetBinaryData();
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                    (&__return_storage_ptr__->pushed_datas,&local_b8);
          core::ByteData::~ByteData(&local_b8);
          local_68 = 1;
        }
      }
      else {
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                  (local_58,0);
        program.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = cfd::core::ScriptElement::GetNumber();
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                  (local_58,1);
        cfd::core::ScriptElement::GetBinaryData();
        __return_storage_ptr__->witness_version =
             (uint)program.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
        bVar1 = cfd::core::Script::IsP2wpkhScript();
        if ((bVar1 & 1) == 0) {
          bVar1 = cfd::core::Script::IsP2wshScript();
          if ((bVar1 & 1) == 0) {
            bVar1 = cfd::core::Script::IsTaprootScript();
            if ((bVar1 & 1) == 0) {
              if (program.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == 0) {
                __return_storage_ptr__->script_type = kNonStandard;
                __return_storage_ptr__->witness_version = kVersionNone;
              }
              else {
                __return_storage_ptr__->script_type = kWitnessUnknown;
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                          (&__return_storage_ptr__->pushed_datas,(value_type *)local_a0);
              }
            }
            else {
              __return_storage_ptr__->script_type = kWitnessV1Taproot;
              std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                        (&__return_storage_ptr__->pushed_datas,(value_type *)local_a0);
            }
          }
          else {
            __return_storage_ptr__->script_type = kWitnessV0ScriptHash;
            std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                      (&__return_storage_ptr__->pushed_datas,(value_type *)local_a0);
          }
        }
        else {
          __return_storage_ptr__->script_type = kWitnessV0KeyHash;
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                    (&__return_storage_ptr__->pushed_datas,(value_type *)local_a0);
        }
        local_68 = 1;
        core::ByteData::~ByteData((ByteData *)local_a0);
      }
    }
    else {
      __return_storage_ptr__->script_type = kPayToScriptHash;
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                (local_58,1);
      cfd::core::ScriptElement::GetBinaryData();
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                (&__return_storage_ptr__->pushed_datas,(value_type *)local_80);
      core::ByteData::~ByteData((ByteData *)local_80);
      local_68 = 1;
    }
  }
  else {
    __return_storage_ptr__->script_type = kFee;
    local_68 = 1;
  }
LAB_0151e1a8:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (local_58);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

ExtractScriptData TransactionStructApiBase::ExtractLockingScript(
    Script locking_script) {
  ExtractScriptData extract_data;

  std::string script_type;
  std::vector<ScriptElement> elems = locking_script.GetElementList();
  // FIXME(fujita-cg): judge anycanspent_aremine flag
  if (elems.size() == 1 && elems[0].GetOpCode() == ScriptOperator::OP_TRUE) {
    extract_data.script_type = LockingScriptType::kTrue;
    return extract_data;
  }
#ifndef CFD_DISABLE_ELEMENTS
  if (locking_script.IsEmpty()) {
    // empty
    extract_data.script_type = LockingScriptType::kFee;
    return extract_data;
  }
#endif  // CFD_DISABLE_ELEMENTS
  if (locking_script.IsP2shScript()) {
    // P2shScript
    extract_data.script_type = LockingScriptType::kPayToScriptHash;
    extract_data.pushed_datas.push_back(elems[1].GetBinaryData());
    return extract_data;
  }

  // WitnessData
  if (locking_script.IsWitnessProgram()) {
    uint8_t witness_version = static_cast<uint8_t>(elems[0].GetNumber());
    ByteData program = elems[1].GetBinaryData();
    extract_data.witness_version =
        static_cast<WitnessVersion>(witness_version);
    if (locking_script.IsP2wpkhScript()) {
      // tx witness keyhash
      extract_data.script_type = LockingScriptType::kWitnessV0KeyHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsP2wshScript()) {
      // tx witness scripthash
      extract_data.script_type = LockingScriptType::kWitnessV0ScriptHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsTaprootScript()) {
      extract_data.script_type = LockingScriptType::kWitnessV1Taproot;
      extract_data.pushed_datas.push_back(program);
    } else if (witness_version != 0) {
      // tx witness unknown
      extract_data.script_type = LockingScriptType::kWitnessUnknown;
      extract_data.pushed_datas.push_back(program);
    } else {
      // non standard
      extract_data.script_type = LockingScriptType::kNonStandard;
      extract_data.witness_version = WitnessVersion::kVersionNone;
    }
    return extract_data;
  }

  if (elems.size() >= 1 && elems[0].GetOpCode() == ScriptOperator::OP_RETURN) {
    // tx null data
    extract_data.script_type = LockingScriptType::kNullData;
    return extract_data;
  }
  if (locking_script.IsP2pkScript()) {
    // tx pubkey
    extract_data.script_type = LockingScriptType::kPayToPubkey;
    extract_data.pushed_datas.push_back(elems[0].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsP2pkhScript()) {
    // tx pubkey hash
    extract_data.script_type = LockingScriptType::kPayToPubkeyHash;
    extract_data.pushed_datas.push_back(elems[2].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsMultisigScript()) {
    // tx multisig
    extract_data.script_type = LockingScriptType::kMultisig;
    decltype(elems)::const_iterator itr = elems.cbegin();
    extract_data.req_sigs = (*itr).GetNumber();
    ++itr;
    for (; itr != (elems.cend() - 2); ++itr) {
      ByteData pubkey_byte = (*itr).GetBinaryData();
      extract_data.pushed_datas.push_back(pubkey_byte);
    }
    return extract_data;
  }

  // tx nonstandard
  extract_data.script_type = LockingScriptType::kNonStandard;
  return extract_data;
}